

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcLaborResource::IfcLaborResource(IfcLaborResource *this)

{
  IfcLaborResource *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x1b0,"IfcLaborResource");
  IfcConstructionResource::IfcConstructionResource
            (&this->super_IfcConstructionResource,&PTR_construction_vtable_24__00e33c78);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcLaborResource,_1UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcLaborResource,_1UL> *)
             &(this->super_IfcConstructionResource).field_0x178,
             &PTR_construction_vtable_24__00e33d68);
  *(undefined8 *)&this->super_IfcConstructionResource = 0xe33b70;
  *(undefined8 *)&this->field_0x1b0 = 0xe33c60;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x88 = 0xe33b98;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x98 = 0xe33bc0;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0xd0 = 0xe33be8;
  (this->super_IfcConstructionResource).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcConstructionResource,_4UL>._vptr_ObjectHelper =
       (_func_int **)0xe33c10;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x178 = 0xe33c38;
  STEP::Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Maybe((Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &(this->super_IfcConstructionResource).field_0x188);
  return;
}

Assistant:

IfcLaborResource() : Object("IfcLaborResource") {}